

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

char * __thiscall CVmMemoryStream::read_line(CVmMemoryStream *this,char *buf,size_t len)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char c;
  size_t rem;
  char *dst;
  size_t len_local;
  char *buf_local;
  CVmMemoryStream *this_local;
  char *local_8;
  
  if (((this->p_ < this->buf_ + this->buflen_) && (buf != (char *)0x0)) &&
     (rem = len, dst = buf, len != 0)) {
    while( true ) {
      bVar3 = false;
      if (1 < rem) {
        bVar3 = this->p_ < this->buf_ + this->buflen_;
      }
      if (!bVar3) goto LAB_0035b59d;
      pcVar2 = this->p_;
      this->p_ = pcVar2 + 1;
      cVar1 = *pcVar2;
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      *dst = cVar1;
      rem = rem - 1;
      dst = dst + 1;
    }
    pcVar2 = dst + 1;
    *dst = '\n';
    dst = pcVar2;
    if ((this->p_ < this->buf_ + this->buflen_) &&
       (((cVar1 == '\n' && (*this->p_ == '\r')) || ((cVar1 == '\r' && (*this->p_ == '\n')))))) {
      this->p_ = this->p_ + 1;
    }
LAB_0035b59d:
    *dst = '\0';
    local_8 = buf;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *read_line(char *buf, size_t len)
    {
        /* if already at EOF, or there's no buffer, return null */
        if (p_ >= buf_ + buflen_ || buf == 0 || len == 0)
            return 0;

        /* read bytes until we fill the buffer or reach '\n' or EOF */
        char *dst;
        size_t rem;
        for (dst = buf, rem = len ; rem > 1 && p_ < buf_ + buflen_ ; --rem)
        {
            /* get this character */
            char c = *p_++;

            /* check for newlines */
            if (c == '\n' || c == '\r')
            {
                /* write CR and LF as simply CR */
                *dst++ = '\n';

                /* if we have a CR-LF or LF-CR sequence, skip the pair */
                if (p_ < buf_ + buflen_
                    && ((c == '\n' && *p_ == '\r')
                        || (c == '\r' && *p_ == '\n')))
                    p_ += 1;

                /* done */
                break;
            }

            /* copy this character */
            *dst++ = c;
        }

        /* add the trailing null and return the buffer */
        *dst = '\0';
        return buf;
    }